

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmainfo.c
# Opt level: O1

char * vma_info(void *ptr)

{
  ulong uVar1;
  int iVar2;
  char *pcVar3;
  FILE *__stream;
  __ssize_t _Var4;
  size_t sVar5;
  char *pcVar6;
  ulong uVar7;
  long lVar8;
  void *__ptr;
  char *line;
  size_t line_n;
  unsigned_long b;
  unsigned_long a;
  char *local_68;
  ulong local_60;
  FILE *local_58;
  size_t local_50;
  void *local_48;
  void *local_40;
  void *local_38;
  
  __stream = (FILE *)0x0;
  local_68 = (char *)0x0;
  local_50 = 0;
  local_48 = ptr;
  pcVar3 = (char *)malloc(0x800);
  if (pcVar3 != (char *)0x0) {
    *pcVar3 = '\0';
    __stream = fopen("/proc/self/smaps","r");
    if (__stream == (FILE *)0x0) {
      __stream = (FILE *)0x0;
    }
    else {
      _Var4 = getline(&local_68,&local_50,__stream);
      if (_Var4 != -1) {
        local_60 = 0;
        local_58 = __stream;
        iVar2 = __isoc99_sscanf(local_68,"%lx-%lx",&local_38,&local_40);
        lVar8 = 3;
        if (((iVar2 == 2) && (lVar8 = 0, local_38 <= local_48)) && (local_48 < local_40)) {
          sVar5 = strlen(pcVar3);
          builtin_strncpy(pcVar3 + sVar5,"    ",5);
          strcat(pcVar3,local_68);
          _Var4 = getline(&local_68,&local_50,__stream);
          if (_Var4 != -1) {
            __ptr = (void *)0x0;
            do {
              uVar1 = local_60;
              pcVar3 = local_68;
              if ((0x19 < (byte)(*local_68 + 0xbfU)) ||
                 (pcVar6 = strchr(local_68,0x3a), pcVar6 == (char *)0x0)) {
                free(pcVar3);
LAB_001d45e0:
                lVar8 = 2;
                local_60 = uVar1;
                break;
              }
              uVar7 = (ulong)((int)uVar1 + 1);
              __ptr = realloc(__ptr,uVar7 * 8);
              if (__ptr == (void *)0x0) goto LAB_001d45e0;
              *(char **)((long)__ptr + (uVar1 & 0xffffffff) * 8) = local_68;
              lVar8 = 0;
              local_68 = (char *)0x0;
              local_50 = 0;
              _Var4 = getline(&local_68,&local_50,local_58);
              local_60 = uVar7;
            } while (_Var4 != -1);
          }
        }
        pcVar3 = (char *)(*(code *)((long)&DAT_001ef88c + (long)(int)(&DAT_001ef88c)[lVar8]))();
        return pcVar3;
      }
    }
  }
  local_58 = __stream;
  free((void *)0x0);
  if (local_58 != (FILE *)0x0) {
    fclose(local_58);
  }
  return pcVar3;
}

Assistant:

char *
vma_info(void *ptr)
{
	FILE *fp = NULL;
	char *buf = NULL;
	char *line = NULL;
	char **pairs = NULL, **tmp = NULL;
	unsigned pairs_cnt = 0;
	size_t line_n = 0;
	buf = malloc(2048);
	if (!buf)
		goto done;
	buf[0] = 0;
	fp = fopen("/proc/self/smaps", "r");
	if (!fp)
		goto done;
	while (getline(&line, &line_n, fp) != -1) {
		unsigned long a, b;
		if (sscanf(line, "%lx-%lx", &a, &b) != 2)
			continue;
		if (a <= (unsigned long)ptr && (unsigned long)ptr < b) {
			/* OK, found it! */
			strcat(buf, "    ");
			strcat(buf, line);
			while (getline(&line, &line_n, fp) != -1) {
				if (line[0] >= 'A' && line[0] <= 'Z'
						&& strchr(line, ':') != NULL) {
					tmp = realloc(pairs, (pairs_cnt+1) * sizeof(char *));
					if (!tmp)
						goto done;
					pairs = tmp;
					pairs[pairs_cnt++] = line;
					line = NULL;
					line_n = 0;
				} else {
					free(line);
					goto done;
				}
			}
		}
	}
done:
	add_smaps(buf, pairs, pairs_cnt);
	free_pairs(pairs, pairs_cnt);
	if (fp)
		fclose(fp);
	return buf;
}